

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,char *value)

{
  char *local_50;
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *value_local;
  cmCMakeHostSystemInformationCommand *this_local;
  string *safe_string;
  
  local_21 = 0;
  local_50 = value;
  if (value == (char *)0x0) {
    local_50 = "";
  }
  local_20 = value;
  value_local = (char *)this;
  this_local = (cmCMakeHostSystemInformationCommand *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_50,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand
::ValueToString(const char *value) const
{
  std::string safe_string = value ? value : "";
  return safe_string;
}